

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O3

__ssize_t cs_impl::istream_cs_ext::getline_abi_cxx11_(char **__lineptr,size_t *__n,FILE *__stream)

{
  istream *piVar1;
  char cVar2;
  char *local_38;
  char *local_30;
  char local_28;
  undefined7 uStack_27;
  char *pcStack_20;
  
  local_30 = (char *)0x0;
  local_28 = '\0';
  piVar1 = (istream *)*__n;
  local_38 = &local_28;
  cVar2 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar1 + -0x18) + (char)piVar1);
  std::getline<char,std::char_traits<char>,std::allocator<char>>(piVar1,(string *)&local_38,cVar2);
  *__lineptr = (char *)(__lineptr + 2);
  if (local_38 == &local_28) {
    __lineptr[2] = (char *)CONCAT71(uStack_27,local_28);
    __lineptr[3] = pcStack_20;
  }
  else {
    *__lineptr = local_38;
    __lineptr[2] = (char *)CONCAT71(uStack_27,local_28);
  }
  __lineptr[1] = local_30;
  return (__ssize_t)__lineptr;
}

Assistant:

string getline(istream &in)
		{
			std::string str;
			std::getline(*in, str);
			return std::move(str);
		}